

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O0

void __thiscall spvtools::opt::DistanceEntry::DistanceEntry(DistanceEntry *this,int64_t x,int64_t y)

{
  int64_t y_local;
  int64_t x_local;
  DistanceEntry *this_local;
  
  this->dependence_information = POINT;
  this->direction = ALL;
  this->distance = 0;
  this->peel_first = false;
  this->peel_last = false;
  this->point_x = x;
  this->point_y = y;
  return;
}

Assistant:

DistanceEntry(int64_t x, int64_t y)
      : dependence_information(DependenceInformation::POINT),
        direction(Directions::ALL),
        distance(0),
        peel_first(false),
        peel_last(false),
        point_x(x),
        point_y(y) {}